

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

xmlChar * htmlParsePubidLiteral(htmlParserCtxtPtr ctxt)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  byte bVar4;
  xmlChar *pxVar5;
  xmlParserInputPtr pxVar6;
  char *msg;
  int len;
  xmlParserErrors error;
  
  bVar1 = *ctxt->input->cur;
  if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
    xmlNextChar(ctxt);
    pxVar6 = ctxt->input;
    pbVar2 = pxVar6->cur;
    pxVar5 = pxVar6->base;
    if (pbVar2 < pxVar6->base) {
      return (xmlChar *)0x0;
    }
    bVar4 = *pbVar2;
    if ((bVar4 == 0) || (bVar4 == bVar1)) {
      if (bVar4 == 0x22) {
        xmlNextChar(ctxt);
        len = 0;
        goto LAB_00151e35;
      }
    }
    else {
      bVar3 = false;
      len = 0;
      do {
        if (""[(long)(ulong)bVar4] == '\0') {
          htmlParseErrInt(ctxt,0x1f69dc,(char *)(ulong)bVar4,(int)pxVar6);
          bVar3 = true;
        }
        len = len + 1;
        xmlNextChar(ctxt);
        bVar4 = *ctxt->input->cur;
      } while ((bVar4 != 0) && (bVar4 != bVar1));
      if (bVar4 == 0x22) {
        xmlNextChar(ctxt);
        if (bVar3) {
          return (xmlChar *)0x0;
        }
LAB_00151e35:
        pxVar5 = xmlStrndup(ctxt->input->base + ((long)pbVar2 - (long)pxVar5),len);
        return pxVar5;
      }
    }
    msg = "Unfinished PubidLiteral\n";
    error = XML_ERR_LITERAL_NOT_FINISHED;
  }
  else {
    msg = "PubidLiteral \" or \' expected\n";
    error = XML_ERR_LITERAL_NOT_STARTED;
  }
  htmlParseErr(ctxt,error,msg,(xmlChar *)0x0,(xmlChar *)0x0);
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
htmlParsePubidLiteral(htmlParserCtxtPtr ctxt) {
    size_t len = 0, startPosition = 0;
    int err = 0;
    int quote;
    xmlChar *ret = NULL;

    if ((CUR != '"') && (CUR != '\'')) {
	htmlParseErr(ctxt, XML_ERR_LITERAL_NOT_STARTED,
	             "PubidLiteral \" or ' expected\n", NULL, NULL);
        return(NULL);
    }
    quote = CUR;
    NEXT;

    /*
     * Name ::= (Letter | '_') (NameChar)*
     */
    if (CUR_PTR < BASE_PTR)
        return(ret);
    startPosition = CUR_PTR - BASE_PTR;

    while ((CUR != 0) && (CUR != quote)) {
        if (!IS_PUBIDCHAR_CH(CUR)) {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Invalid char in PubidLiteral 0x%X\n", CUR);
            err = 1;
        }
        len++;
        NEXT;
    }

    if (CUR != '"') {
        htmlParseErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED,
                     "Unfinished PubidLiteral\n", NULL, NULL);
    } else {
        NEXT;
        if (err == 0)
            ret = xmlStrndup((BASE_PTR + startPosition), len);
    }

    return(ret);
}